

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O2

shared_ptr<const_pstore::repo::linked_definitions> __thiscall
pstore::repo::linked_definitions::load
          (linked_definitions *this,database *db,typed_address<pstore::repo::linked_definitions> ld)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::repo::linked_definitions> sVar1;
  shared_ptr<const_pstore::repo::linked_definitions> ln;
  
  database::getro<pstore::repo::linked_definitions,void>
            ((database *)&stack0xffffffffffffffd0,
             (typed_address<pstore::repo::linked_definitions>)db);
  database::getro<pstore::repo::linked_definitions,void>
            ((database *)this,(typed_address<pstore::repo::linked_definitions>)db,(size_t)ld.a_.a_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  sVar1.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_pstore::repo::linked_definitions>)
         sVar1.
         super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<linked_definitions const>
        linked_definitions::load (database const & db, typed_address<linked_definitions> const ld) {
            // First work out its size, then read the full-size of the object.
            std::shared_ptr<linked_definitions const> const ln = db.getro (ld);
            return db.getro (ld, linked_definitions::size_bytes (ln->size ()));
        }